

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * __thiscall cmFileAPI::AddReplyIndexObject(cmFileAPI *this,Object *o)

{
  bool bVar1;
  mapped_type *this_00;
  Value *pVVar2;
  Value *pVVar3;
  Object *o_00;
  Value local_b0;
  string local_88;
  string local_68;
  Value local_48;
  
  this_00 = std::
            map<cmFileAPI::Object,_Json::Value,_std::less<cmFileAPI::Object>,_std::allocator<std::pair<const_cmFileAPI::Object,_Json::Value>_>_>
            ::operator[](&this->ReplyIndexObjects,o);
  bVar1 = Json::Value::isNull(this_00);
  if (bVar1) {
    BuildObject(&local_b0,this,o);
    bVar1 = Json::Value::isObject(&local_b0);
    if (!bVar1) {
      __assert_fail("object.isObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileAPI.cxx"
                    ,400,"const Json::Value &cmFileAPI::AddReplyIndexObject(const Object &)");
    }
    Json::Value::Value(&local_48,objectValue);
    Json::Value::operator=(this_00,&local_48);
    Json::Value::~Value(&local_48);
    pVVar2 = Json::Value::operator[](&local_b0,"kind");
    pVVar3 = Json::Value::operator[](this_00,"kind");
    Json::Value::operator=(pVVar3,pVVar2);
    pVVar2 = Json::Value::operator[](&local_b0,"version");
    pVVar3 = Json::Value::operator[](this_00,"version");
    Json::Value::operator=(pVVar3,pVVar2);
    ObjectName_abi_cxx11_(&local_88,(cmFileAPI *)o,o_00);
    WriteJsonFile(&local_68,this,&local_b0,&local_88,ComputeSuffixHash);
    Json::Value::Value(&local_48,&local_68);
    pVVar2 = Json::Value::operator[](this_00,"jsonFile");
    Json::Value::operator=(pVVar2,&local_48);
    Json::Value::~Value(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    Json::Value::~Value(&local_b0);
  }
  return this_00;
}

Assistant:

Json::Value const& cmFileAPI::AddReplyIndexObject(Object const& o)
{
  Json::Value& indexEntry = this->ReplyIndexObjects[o];
  if (!indexEntry.isNull()) {
    // The reply object has already been generated.
    return indexEntry;
  }

  // Generate this reply object.
  Json::Value const& object = this->BuildObject(o);
  assert(object.isObject());

  // Populate this index entry.
  indexEntry = Json::objectValue;
  indexEntry["kind"] = object["kind"];
  indexEntry["version"] = object["version"];
  indexEntry["jsonFile"] = this->WriteJsonFile(object, ObjectName(o));
  return indexEntry;
}